

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpressionGenerator.cpp
# Opt level: O2

void __thiscall rsg::ExpressionGenerator::generate(ExpressionGenerator *this,Expression *root)

{
  int *piVar1;
  pointer *pppEVar2;
  pointer ppEVar3;
  int iVar4;
  undefined4 extraout_var;
  Expression *child;
  Expression *root_local;
  
  root_local = root;
  std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::push_back
            (&this->m_expressionStack,&root_local);
  piVar1 = &this->m_state->m_expressionDepth;
  *piVar1 = *piVar1 + 1;
  while (ppEVar3 = (this->m_expressionStack).
                   super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,
        (this->m_expressionStack).
        super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppEVar3) {
    iVar4 = (*ppEVar3[-1]->_vptr_Expression[2])();
    child = (Expression *)CONCAT44(extraout_var,iVar4);
    if (child == (Expression *)0x0) {
      pppEVar2 = &(this->m_expressionStack).
                  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      iVar4 = -1;
    }
    else {
      std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::push_back
                (&this->m_expressionStack,&child);
      iVar4 = 1;
    }
    piVar1 = &this->m_state->m_expressionDepth;
    *piVar1 = *piVar1 + iVar4;
  }
  return;
}

Assistant:

void ExpressionGenerator::generate (Expression* root)
{
	DE_ASSERT(m_expressionStack.empty());

	// Initialize stack
	m_expressionStack.push_back(root);
	m_state.setExpressionDepth(m_state.getExpressionDepth()+1);

	// Process until done
	while (!m_expressionStack.empty())
	{
		DE_ASSERT(m_state.getExpressionDepth() <= m_state.getShaderParameters().maxExpressionDepth);

		Expression* curExpr = m_expressionStack[m_expressionStack.size()-1];
		Expression*	child	= curExpr->createNextChild(m_state);

		if (child)
		{
			m_expressionStack.push_back(child);
			m_state.setExpressionDepth(m_state.getExpressionDepth()+1);
		}
		else
		{
			m_expressionStack.pop_back();
			m_state.setExpressionDepth(m_state.getExpressionDepth()-1);
		}
	}
}